

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiAgentDecisionProcessDiscreteFactoredStates.cpp
# Opt level: O0

Index __thiscall
MultiAgentDecisionProcessDiscreteFactoredStates::SampleSuccessorState
          (MultiAgentDecisionProcessDiscreteFactoredStates *this,Index sI,Index jaI)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  undefined4 in_EDX;
  undefined4 in_ESI;
  long *in_RDI;
  vector<unsigned_int,_std::allocator<unsigned_int>_> Y;
  vector<unsigned_int,_std::allocator<unsigned_int>_> A;
  vector<unsigned_int,_std::allocator<unsigned_int>_> X;
  TransitionModelDiscrete *in_stack_ffffffffffffff90;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffffb8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffffc0;
  undefined1 local_30 [24];
  undefined4 local_18;
  Index local_4;
  
  if (((*(byte *)(in_RDI + 0x48) & 1) == 0) || ((*(byte *)((long)in_RDI + 0x244) & 1) == 0)) {
    local_18 = in_EDX;
    (**(code **)(*in_RDI + 0xd8))(local_30,in_RDI,in_ESI);
    this_00 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
              (**(code **)(*in_RDI + 0x140))(in_RDI,local_18);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0xae72e8);
    (**(code **)(*in_RDI + 0x210))
              (in_RDI,local_30,&stack0xffffffffffffffb8,&stack0xffffffffffffff90);
    local_4 = (**(code **)(*in_RDI + 0xe8))(in_RDI,&stack0xffffffffffffff90);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(this_00);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(this_00);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(this_00);
  }
  else {
    local_4 = TransitionModelDiscrete::SampleSuccessorState
                        (in_stack_ffffffffffffff90,(Index)((ulong)in_RDI >> 0x20),(Index)in_RDI);
  }
  return local_4;
}

Assistant:

Index MultiAgentDecisionProcessDiscreteFactoredStates::
SampleSuccessorState (Index sI, Index jaI) const
{
    if(_m_cached_FlatTM && _m_eventObservability)
        return _m_p_tModel->SampleSuccessorState(sI, jaI);

    vector<Index> X = StateIndexToFactorValueIndices(sI);
    vector<Index> A = JointToIndividualActionIndices(jaI);
    vector<Index> Y;
    SampleSuccessorState(X,A,Y);
    return( FactorValueIndicesToStateIndex(Y) );
}